

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

uint GetBinaryOpPrecedence(SynBinaryOpType op)

{
  uint local_c;
  SynBinaryOpType op_local;
  
  switch(op) {
  case SYN_BINARY_OP_ADD:
    local_c = 2;
    break;
  case SYN_BINARY_OP_SUB:
    local_c = 2;
    break;
  case SYN_BINARY_OP_MUL:
    local_c = 1;
    break;
  case SYN_BINARY_OP_DIV:
    local_c = 1;
    break;
  case SYN_BINARY_OP_MOD:
    local_c = 1;
    break;
  case SYN_BINARY_OP_POW:
    local_c = 0;
    break;
  case SYN_BINARY_OP_SHL:
    local_c = 3;
    break;
  case SYN_BINARY_OP_SHR:
    local_c = 3;
    break;
  case SYN_BINARY_OP_LESS:
    local_c = 4;
    break;
  case SYN_BINARY_OP_LESS_EQUAL:
    local_c = 4;
    break;
  case SYN_BINARY_OP_GREATER:
    local_c = 4;
    break;
  case SYN_BINARY_OP_GREATER_EQUAL:
    local_c = 4;
    break;
  case SYN_BINARY_OP_EQUAL:
    local_c = 5;
    break;
  case SYN_BINARY_OP_NOT_EQUAL:
    local_c = 5;
    break;
  case SYN_BINARY_OP_BIT_AND:
    local_c = 6;
    break;
  case SYN_BINARY_OP_BIT_OR:
    local_c = 8;
    break;
  case SYN_BINARY_OP_BIT_XOR:
    local_c = 7;
    break;
  case SYN_BINARY_OP_LOGICAL_AND:
    local_c = 9;
    break;
  case SYN_BINARY_OP_LOGICAL_OR:
    local_c = 0xb;
    break;
  case SYN_BINARY_OP_LOGICAL_XOR:
    local_c = 10;
    break;
  case SYN_BINARY_OP_IN:
    local_c = 0xc;
    break;
  default:
    local_c = 0;
  }
  return local_c;
}

Assistant:

unsigned GetBinaryOpPrecedence(SynBinaryOpType op)
{
	switch(op)
	{
	case SYN_BINARY_OP_ADD:
		return 2;
	case SYN_BINARY_OP_SUB:
		return 2;
	case SYN_BINARY_OP_MUL:
		return 1;
	case SYN_BINARY_OP_DIV:
		return 1;
	case SYN_BINARY_OP_MOD:
		return 1;
	case SYN_BINARY_OP_POW:
		return 0;
	case SYN_BINARY_OP_LESS:
		return 4;
	case SYN_BINARY_OP_LESS_EQUAL:
		return 4;
	case SYN_BINARY_OP_SHL:
		return 3;
	case SYN_BINARY_OP_GREATER:
		return 4;
	case SYN_BINARY_OP_GREATER_EQUAL:
		return 4;
	case SYN_BINARY_OP_SHR:
		return 3;
	case SYN_BINARY_OP_EQUAL:
		return 5;
	case SYN_BINARY_OP_NOT_EQUAL:
		return 5;
	case SYN_BINARY_OP_BIT_AND:
		return 6;
	case SYN_BINARY_OP_BIT_OR:
		return 8;
	case SYN_BINARY_OP_BIT_XOR:
		return 7;
	case SYN_BINARY_OP_LOGICAL_AND:
		return 9;
	case SYN_BINARY_OP_LOGICAL_OR:
		return 11;
	case SYN_BINARY_OP_LOGICAL_XOR:
		return 10;
	case SYN_BINARY_OP_IN:
		return 12;
	default:
		break;
	}

	return 0;
}